

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O2

uint __thiscall
llvm::DWARFVerifier::verifyNameIndexBuckets
          (DWARFVerifier *this,NameIndex *NI,DataExtractor *StrData)

{
  uint32_t uVar1;
  pointer pBVar2;
  raw_ostream *prVar3;
  _Vector_base<BucketInfo,_std::allocator<BucketInfo>_> *p_Var4;
  pointer pBVar5;
  pointer pBVar6;
  BucketInfo *pBVar7;
  size_t __n;
  DataExtractor *extraout_RDX;
  DataExtractor *__s;
  DataExtractor *extraout_RDX_00;
  DataExtractor *extraout_RDX_01;
  DataExtractor *extraout_RDX_02;
  long lVar8;
  NameIndex *__p;
  BucketInfo *B;
  NameIndex *__nmemb;
  uint uVar9;
  uint32_t uVar10;
  uint uVar11;
  int iVar12;
  BucketInfo *pBVar13;
  StringRef Buffer;
  StringRef Buffer_00;
  undefined1 local_140 [152];
  char *local_a8;
  StringRef local_a0;
  uint32_t local_90;
  uint32_t local_8c;
  DWARFVerifier *local_88;
  uint local_80;
  uint32_t local_7c;
  uint32_t FirstHash;
  uint32_t Hash;
  vector<BucketInfo,_std::allocator<BucketInfo>_> BucketStarts;
  BucketInfo *local_58;
  BucketInfo local_50;
  char *Str;
  undefined8 local_40;
  uint32_t Bucket;
  uint32_t local_34;
  uint32_t NextUncovered;
  uint32_t Idx;
  
  uVar1 = (NI->Hdr).super_HeaderPOD.BucketCount;
  if (uVar1 == 0) {
    prVar3 = warn(this);
    _FirstHash = (pointer)NI->Base;
    formatv<unsigned_long>
              ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>_>_> *
               )local_140,"Name Index @ {0:x} does not contain a hash table.\n",
               (unsigned_long *)&FirstHash);
    raw_ostream::operator<<(prVar3,(formatv_object_base *)local_140);
    formatv_object_base::~formatv_object_base((formatv_object_base *)local_140);
    Str._0_4_ = 0;
  }
  else {
    BucketStarts.super__Vector_base<BucketInfo,_std::allocator<BucketInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    _FirstHash = (pointer)0x0;
    BucketStarts.super__Vector_base<BucketInfo,_std::allocator<BucketInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    uVar9 = 0;
    uVar11 = uVar1 + 1;
    local_88 = this;
    if (uVar11 == 0) {
      local_8c = 0xffffffff;
      BucketStarts.super__Vector_base<BucketInfo,_std::allocator<BucketInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __p = NI;
    }
    else {
      pBVar2 = std::_Vector_base<BucketInfo,_std::allocator<BucketInfo>_>::_M_allocate
                         ((_Vector_base<BucketInfo,_std::allocator<BucketInfo>_> *)(ulong)uVar11,
                          (size_t)NI);
      __p = (NameIndex *)0x0;
      std::_Vector_base<BucketInfo,_std::allocator<BucketInfo>_>::_M_deallocate
                ((_Vector_base<BucketInfo,_std::allocator<BucketInfo>_> *)0x0,(pointer)0x0,__n);
      BucketStarts.super__Vector_base<BucketInfo,_std::allocator<BucketInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pBVar2 + (long)(ulong)uVar11;
      local_8c = (NI->Hdr).super_HeaderPOD.BucketCount;
      StrData = extraout_RDX;
      BucketStarts.super__Vector_base<BucketInfo,_std::allocator<BucketInfo>_>._M_impl.
      super__Vector_impl_data._M_start = pBVar2;
    }
    local_40 = (ulong)local_40._4_4_ << 0x20;
    Str = (char *)((ulong)Str._4_4_ << 0x20);
    pBVar2 = BucketStarts.super__Vector_base<BucketInfo,_std::allocator<BucketInfo>_>._M_impl.
             super__Vector_impl_data._M_start;
    _FirstHash = BucketStarts.super__Vector_base<BucketInfo,_std::allocator<BucketInfo>_>._M_impl.
                 super__Vector_impl_data._M_start;
    BucketStarts.super__Vector_base<BucketInfo,_std::allocator<BucketInfo>_>._M_impl.
    super__Vector_impl_data._M_finish =
         BucketStarts.super__Vector_base<BucketInfo,_std::allocator<BucketInfo>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_58 = BucketStarts.super__Vector_base<BucketInfo,_std::allocator<BucketInfo>_>._M_impl.
               super__Vector_impl_data._M_start;
    uVar1 = local_8c;
    while (uVar9 < uVar1) {
      __p = (NameIndex *)(ulong)uVar9;
      Bucket = DWARFDebugNames::NameIndex::getBucketArrayEntry(NI,uVar9);
      pBVar13 = pBVar2;
      if ((NI->Hdr).super_HeaderPOD.NameCount < Bucket) {
        prVar3 = error(local_88);
        local_50 = (BucketInfo)NI->Base;
        local_34 = (NI->Hdr).super_HeaderPOD.NameCount;
        formatv<unsigned_int_&,_unsigned_long,_unsigned_int_&,_unsigned_int>
                  ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>_>_>
                    *)local_140,
                   "Bucket {0} of Name Index @ {1:x} contains invalid value {2}. Valid range is [0, {3}].\n"
                   ,(uint *)&local_40,(unsigned_long *)&local_50,&Bucket,&local_34);
        __p = (NameIndex *)local_140;
        raw_ostream::operator<<(prVar3,(formatv_object_base *)local_140);
        formatv_object_base::~formatv_object_base((formatv_object_base *)local_140);
        Str = (char *)CONCAT44(Str._4_4_,(uint)Str + 1);
        StrData = extraout_RDX_00;
      }
      else {
        StrData = __s;
        if (Bucket != 0) {
          if (pBVar2 == BucketStarts.super__Vector_base<BucketInfo,_std::allocator<BucketInfo>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
            p_Var4 = (_Vector_base<BucketInfo,_std::allocator<BucketInfo>_> *)
                     std::vector<BucketInfo,_std::allocator<BucketInfo>_>::_M_check_len
                               ((vector<BucketInfo,_std::allocator<BucketInfo>_> *)&FirstHash,
                                (size_type)__p,(char *)__s);
            pBVar5 = std::_Vector_base<BucketInfo,_std::allocator<BucketInfo>_>::_M_allocate
                               (p_Var4,(size_t)__p);
            lVar8 = (long)pBVar2 - (long)local_58;
            *(uint32_t *)((long)pBVar5 + lVar8) = (uint32_t)local_40;
            *(uint32_t *)((long)pBVar5 + lVar8 + 4) = Bucket;
            pBVar6 = pBVar5;
            for (pBVar7 = local_58; pBVar13 = pBVar6 + 1, pBVar7 != pBVar2; pBVar7 = pBVar7 + 1) {
              *pBVar6 = *pBVar7;
              pBVar6 = pBVar13;
            }
            __p = (NameIndex *)(lVar8 >> 3);
            std::_Vector_base<BucketInfo,_std::allocator<BucketInfo>_>::_M_deallocate
                      ((_Vector_base<BucketInfo,_std::allocator<BucketInfo>_> *)local_58,
                       (pointer)__p,(size_t)local_58);
            BucketStarts.super__Vector_base<BucketInfo,_std::allocator<BucketInfo>_>._M_impl.
            super__Vector_impl_data._M_finish = pBVar5 + (long)p_Var4;
            StrData = extraout_RDX_01;
            _FirstHash = pBVar5;
            BucketStarts.super__Vector_base<BucketInfo,_std::allocator<BucketInfo>_>._M_impl.
            super__Vector_impl_data._M_start = pBVar13;
            BucketStarts.super__Vector_base<BucketInfo,_std::allocator<BucketInfo>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 BucketStarts.super__Vector_base<BucketInfo,_std::allocator<BucketInfo>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            local_58 = pBVar5;
            uVar1 = local_8c;
          }
          else {
            pBVar2->Bucket = (uint32_t)local_40;
            pBVar2->Index = Bucket;
            pBVar13 = pBVar2 + 1;
            BucketStarts.super__Vector_base<BucketInfo,_std::allocator<BucketInfo>_>._M_impl.
            super__Vector_impl_data._M_start = pBVar13;
          }
        }
      }
      uVar9 = (uint32_t)local_40 + 1;
      local_40 = CONCAT44(local_40._4_4_,uVar9);
      pBVar2 = pBVar13;
    }
    if ((uint)Str == 0) {
      lVar8 = (long)pBVar2 - (long)local_58;
      __nmemb = (NameIndex *)(lVar8 >> 3);
      if (1 < (long)__nmemb) {
        __p = __nmemb;
        qsort(local_58,(size_t)__nmemb,8,
              array_pod_sort_comparator<llvm::DWARFVerifier::verifyNameIndexBuckets(llvm::DWARFDebugNames::NameIndex_const&,llvm::DataExtractor_const&)::BucketInfo>
             );
        BucketStarts.super__Vector_base<BucketInfo,_std::allocator<BucketInfo>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             BucketStarts.super__Vector_base<BucketInfo,_std::allocator<BucketInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
        StrData = extraout_RDX_02;
      }
      uVar1 = (NI->Hdr).super_HeaderPOD.BucketCount;
      uVar10 = (NI->Hdr).super_HeaderPOD.NameCount + 1;
      if (pBVar2 == BucketStarts.super__Vector_base<BucketInfo,_std::allocator<BucketInfo>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage) {
        BucketStarts.super__Vector_base<BucketInfo,_std::allocator<BucketInfo>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)CONCAT44(BucketStarts.
                               super__Vector_base<BucketInfo,_std::allocator<BucketInfo>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage._4_4_,uVar1);
        Str = (char *)__nmemb;
        p_Var4 = (_Vector_base<BucketInfo,_std::allocator<BucketInfo>_> *)
                 std::vector<BucketInfo,_std::allocator<BucketInfo>_>::_M_check_len
                           ((vector<BucketInfo,_std::allocator<BucketInfo>_> *)&FirstHash,
                            (size_type)__p,(char *)StrData);
        pBVar6 = std::_Vector_base<BucketInfo,_std::allocator<BucketInfo>_>::_M_allocate
                           (p_Var4,(size_t)__p);
        *(undefined4 *)((long)pBVar6 + lVar8) =
             BucketStarts.super__Vector_base<BucketInfo,_std::allocator<BucketInfo>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._0_4_;
        *(uint32_t *)((long)pBVar6 + lVar8 + 4) = uVar10;
        pBVar13 = pBVar6;
        for (pBVar7 = local_58; pBVar7 != pBVar2; pBVar7 = pBVar7 + 1) {
          *pBVar13 = *pBVar7;
          pBVar13 = pBVar13 + 1;
        }
        std::_Vector_base<BucketInfo,_std::allocator<BucketInfo>_>::_M_deallocate
                  ((_Vector_base<BucketInfo,_std::allocator<BucketInfo>_> *)local_58,(pointer)Str,
                   (size_t)p_Var4);
        BucketStarts.super__Vector_base<BucketInfo,_std::allocator<BucketInfo>_>._M_impl.
        super__Vector_impl_data._M_finish = pBVar6 + (long)p_Var4;
        _FirstHash = pBVar6;
        Str = (char *)(pBVar13 + 1);
      }
      else {
        pBVar2->Bucket = uVar1;
        pBVar2->Index = uVar10;
        Str = (char *)(pBVar2 + 1);
      }
      Bucket = 1;
      iVar12 = 0;
      BucketStarts.super__Vector_base<BucketInfo,_std::allocator<BucketInfo>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)Str;
      for (pBVar2 = _FirstHash; pBVar2 != (pointer)Str; pBVar2 = pBVar2 + 1) {
        uVar9 = pBVar2->Index;
        if (Bucket < uVar9) {
          prVar3 = error(local_88);
          local_50 = (BucketInfo)NI->Base;
          local_40 = CONCAT44(local_40._4_4_,pBVar2->Index - 1);
          formatv<unsigned_long,_unsigned_int_&,_unsigned_int>
                    ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>_>_>
                      *)local_140,
                     "Name Index @ {0:x}: Name table entries [{1}, {2}] are not covered by the hash table.\n"
                     ,(unsigned_long *)&local_50,&Bucket,(uint *)&local_40);
          raw_ostream::operator<<(prVar3,(formatv_object_base *)local_140);
          formatv_object_base::~formatv_object_base((formatv_object_base *)local_140);
          iVar12 = iVar12 + 1;
          uVar9 = pBVar2->Index;
        }
        pBVar6 = (pointer)(ulong)pBVar2->Bucket;
        local_34 = uVar9;
        if (pBVar2->Bucket == (NI->Hdr).super_HeaderPOD.BucketCount) break;
        local_80 = DWARFDebugNames::NameIndex::getHashArrayEntry(NI,uVar9);
        if (local_80 % (NI->Hdr).super_HeaderPOD.BucketCount != pBVar2->Bucket) {
          prVar3 = error(local_88);
          local_50 = (BucketInfo)NI->Base;
          local_40 = CONCAT44(local_40._4_4_,local_80 % (NI->Hdr).super_HeaderPOD.BucketCount);
          pBVar6 = pBVar2;
          formatv<unsigned_long,_const_unsigned_int_&,_unsigned_int_&,_unsigned_int>
                    ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>_>_>
                      *)local_140,
                     "Name Index @ {0:x}: Bucket {1} is not empty but points to a mismatched hash value {2:x} (belonging to bucket {3}).\n"
                     ,(unsigned_long *)&local_50,&pBVar2->Bucket,&local_80,(uint *)&local_40);
          raw_ostream::operator<<(prVar3,(formatv_object_base *)local_140);
          formatv_object_base::~formatv_object_base((formatv_object_base *)local_140);
          iVar12 = iVar12 + 1;
        }
        while ((local_34 <= (NI->Hdr).super_HeaderPOD.NameCount &&
               (local_7c = DWARFDebugNames::NameIndex::getHashArrayEntry(NI,local_34),
               local_7c % (NI->Hdr).super_HeaderPOD.BucketCount == pBVar2->Bucket))) {
          DWARFDebugNames::NameIndex::getNameTableEntry((NameTableEntry *)local_140,NI,local_34);
          local_50 = (BucketInfo)
                     DWARFDebugNames::NameTableEntry::getString((NameTableEntry *)local_140);
          StringRef::StringRef((StringRef *)(local_140 + 0x90),(char *)local_50);
          Buffer.Length = 0x1505;
          Buffer.Data = local_a8;
          uVar1 = caseFoldingDjbHash((llvm *)local_140._144_8_,Buffer,(uint32_t)pBVar6);
          uVar10 = (uint32_t)pBVar6;
          if (uVar1 != local_7c) {
            prVar3 = error(local_88);
            local_40 = NI->Base;
            StringRef::StringRef(&local_a0,(char *)local_50);
            Buffer_00.Length = 0x1505;
            Buffer_00.Data = (char *)local_a0.Length;
            local_90 = caseFoldingDjbHash((llvm *)local_a0.Data,Buffer_00,uVar10);
            pBVar6 = &local_50;
            formatv<unsigned_long,_const_char_*&,_unsigned_int_&,_unsigned_int,_unsigned_int_&>
                      ((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_char_*&>,_llvm::detail::provider_format_adapter<unsigned_int_&>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>_>
                        *)local_140,
                       "Name Index @ {0:x}: String ({1}) at index {2} hashes to {3:x}, but the Name Index hash is {4:x}\n"
                       ,&local_40,(char **)pBVar6,&local_34,&local_90,&local_7c);
            raw_ostream::operator<<(prVar3,(formatv_object_base *)local_140);
            formatv_object_base::~formatv_object_base((formatv_object_base *)local_140);
            iVar12 = iVar12 + 1;
          }
          local_34 = local_34 + 1;
        }
        uVar1 = local_34;
        if (local_34 < Bucket) {
          uVar1 = Bucket;
        }
        Bucket = uVar1;
      }
      Str = (char *)CONCAT44(Str._4_4_,iVar12);
    }
    std::vector<BucketInfo,_std::allocator<BucketInfo>_>::~vector
              ((vector<BucketInfo,_std::allocator<BucketInfo>_> *)&FirstHash);
  }
  return (uint)Str;
}

Assistant:

unsigned
DWARFVerifier::verifyNameIndexBuckets(const DWARFDebugNames::NameIndex &NI,
                                      const DataExtractor &StrData) {
  struct BucketInfo {
    uint32_t Bucket;
    uint32_t Index;

    constexpr BucketInfo(uint32_t Bucket, uint32_t Index)
        : Bucket(Bucket), Index(Index) {}
    bool operator<(const BucketInfo &RHS) const { return Index < RHS.Index; };
  };

  uint32_t NumErrors = 0;
  if (NI.getBucketCount() == 0) {
    warn() << formatv("Name Index @ {0:x} does not contain a hash table.\n",
                      NI.getUnitOffset());
    return NumErrors;
  }

  // Build up a list of (Bucket, Index) pairs. We use this later to verify that
  // each Name is reachable from the appropriate bucket.
  std::vector<BucketInfo> BucketStarts;
  BucketStarts.reserve(NI.getBucketCount() + 1);
  for (uint32_t Bucket = 0, End = NI.getBucketCount(); Bucket < End; ++Bucket) {
    uint32_t Index = NI.getBucketArrayEntry(Bucket);
    if (Index > NI.getNameCount()) {
      error() << formatv("Bucket {0} of Name Index @ {1:x} contains invalid "
                         "value {2}. Valid range is [0, {3}].\n",
                         Bucket, NI.getUnitOffset(), Index, NI.getNameCount());
      ++NumErrors;
      continue;
    }
    if (Index > 0)
      BucketStarts.emplace_back(Bucket, Index);
  }

  // If there were any buckets with invalid values, skip further checks as they
  // will likely produce many errors which will only confuse the actual root
  // problem.
  if (NumErrors > 0)
    return NumErrors;

  // Sort the list in the order of increasing "Index" entries.
  array_pod_sort(BucketStarts.begin(), BucketStarts.end());

  // Insert a sentinel entry at the end, so we can check that the end of the
  // table is covered in the loop below.
  BucketStarts.emplace_back(NI.getBucketCount(), NI.getNameCount() + 1);

  // Loop invariant: NextUncovered is the (1-based) index of the first Name
  // which is not reachable by any of the buckets we processed so far (and
  // hasn't been reported as uncovered).
  uint32_t NextUncovered = 1;
  for (const BucketInfo &B : BucketStarts) {
    // Under normal circumstances B.Index be equal to NextUncovered, but it can
    // be less if a bucket points to names which are already known to be in some
    // bucket we processed earlier. In that case, we won't trigger this error,
    // but report the mismatched hash value error instead. (We know the hash
    // will not match because we have already verified that the name's hash
    // puts it into the previous bucket.)
    if (B.Index > NextUncovered) {
      error() << formatv("Name Index @ {0:x}: Name table entries [{1}, {2}] "
                         "are not covered by the hash table.\n",
                         NI.getUnitOffset(), NextUncovered, B.Index - 1);
      ++NumErrors;
    }
    uint32_t Idx = B.Index;

    // The rest of the checks apply only to non-sentinel entries.
    if (B.Bucket == NI.getBucketCount())
      break;

    // This triggers if a non-empty bucket points to a name with a mismatched
    // hash. Clients are likely to interpret this as an empty bucket, because a
    // mismatched hash signals the end of a bucket, but if this is indeed an
    // empty bucket, the producer should have signalled this by marking the
    // bucket as empty.
    uint32_t FirstHash = NI.getHashArrayEntry(Idx);
    if (FirstHash % NI.getBucketCount() != B.Bucket) {
      error() << formatv(
          "Name Index @ {0:x}: Bucket {1} is not empty but points to a "
          "mismatched hash value {2:x} (belonging to bucket {3}).\n",
          NI.getUnitOffset(), B.Bucket, FirstHash,
          FirstHash % NI.getBucketCount());
      ++NumErrors;
    }

    // This find the end of this bucket and also verifies that all the hashes in
    // this bucket are correct by comparing the stored hashes to the ones we
    // compute ourselves.
    while (Idx <= NI.getNameCount()) {
      uint32_t Hash = NI.getHashArrayEntry(Idx);
      if (Hash % NI.getBucketCount() != B.Bucket)
        break;

      const char *Str = NI.getNameTableEntry(Idx).getString();
      if (caseFoldingDjbHash(Str) != Hash) {
        error() << formatv("Name Index @ {0:x}: String ({1}) at index {2} "
                           "hashes to {3:x}, but "
                           "the Name Index hash is {4:x}\n",
                           NI.getUnitOffset(), Str, Idx,
                           caseFoldingDjbHash(Str), Hash);
        ++NumErrors;
      }

      ++Idx;
    }
    NextUncovered = std::max(NextUncovered, Idx);
  }
  return NumErrors;
}